

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFPageObjectHelper::placeFormXObject
          (string *__return_storage_ptr__,QPDFPageObjectHelper *this,QPDFObjectHandle *fo,
          string *name,Rectangle rect,QPDFMatrix *cm,bool invert_transformations,bool allow_shrink,
          bool allow_expand)

{
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  QPDFObjectHandle local_78;
  QPDFMatrix local_68;
  byte local_33;
  byte local_32;
  byte local_31;
  bool allow_expand_local;
  bool allow_shrink_local;
  QPDFMatrix *pQStack_30;
  bool invert_transformations_local;
  QPDFMatrix *cm_local;
  string *name_local;
  QPDFObjectHandle *fo_local;
  QPDFPageObjectHelper *this_local;
  
  local_32 = allow_shrink;
  local_33 = allow_expand;
  local_31 = invert_transformations;
  pQStack_30 = cm;
  cm_local = (QPDFMatrix *)name;
  name_local = (string *)fo;
  fo_local = (QPDFObjectHandle *)this;
  this_local = (QPDFPageObjectHelper *)__return_storage_ptr__;
  QPDFObjectHandle::QPDFObjectHandle(&local_78,fo);
  local_98 = rect.llx;
  dStack_90 = rect.lly;
  local_88 = rect.urx;
  dStack_80 = rect.ury;
  getMatrixForFormXObjectPlacement
            (&local_68,this,&local_78,rect,(bool)(local_31 & 1),(bool)(local_32 & 1),
             (bool)(local_33 & 1));
  pQStack_30->e = local_68.e;
  pQStack_30->f = local_68.f;
  pQStack_30->c = local_68.c;
  pQStack_30->d = local_68.d;
  pQStack_30->a = local_68.a;
  pQStack_30->b = local_68.b;
  QPDFObjectHandle::~QPDFObjectHandle(&local_78);
  QPDFMatrix::unparse_abi_cxx11_(&local_148,pQStack_30);
  std::operator+(&local_128,"q\n",&local_148);
  std::operator+(&local_108,&local_128," cm\n");
  std::operator+(&local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cm_local);
  std::operator+(&local_c8,&local_e8," Do\n");
  std::operator+(__return_storage_ptr__,&local_c8,"Q\n");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFPageObjectHelper::placeFormXObject(
    QPDFObjectHandle fo,
    std::string const& name,
    QPDFObjectHandle::Rectangle rect,
    QPDFMatrix& cm,
    bool invert_transformations,
    bool allow_shrink,
    bool allow_expand)
{
    cm = getMatrixForFormXObjectPlacement(
        fo, rect, invert_transformations, allow_shrink, allow_expand);
    return ("q\n" + cm.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}